

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * __thiscall
clipp::group::push_back<clipp::group,clipp::parameter>(group *this,group *param1,parameter *param2)

{
  size_type sVar1;
  parameter *param2_local;
  group *param1_local;
  group *this_local;
  
  sVar1 = std::
          vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
          ::size(&this->children_);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::reserve(&this->children_,sVar1 + 2);
  push_back(this,param1);
  push_back(this,param2);
  return this;
}

Assistant:

group&
    push_back(Param1&& param1, Param2&& param2, Params&&... params)
    {
        children_.reserve(children_.size() + 2 + sizeof...(params));
        push_back(std::forward<Param1>(param1));
        push_back(std::forward<Param2>(param2), std::forward<Params>(params)...);
        return *this;
    }